

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedStringFieldGenerator::GenerateMergeFromCodedStream
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Type TVar2;
  FileDescriptor *file;
  Printer *printer_local;
  RepeatedStringFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "DO_(::google::protobuf::internal::WireFormatLite::Read$declared_type$(\n      input, this->add_$name$()));\n"
                    );
  file = FieldDescriptor::file(this->descriptor_);
  bVar1 = HasUtf8Verification(file);
  if ((bVar1) && (TVar2 = FieldDescriptor::type(this->descriptor_), TVar2 == TYPE_STRING)) {
    io::Printer::Print(printer,&this->variables_,
                       "::google::protobuf::internal::WireFormat::VerifyUTF8String(\n  this->$name$(this->$name$_size() - 1).data(),\n  this->$name$(this->$name$_size() - 1).length(),\n  ::google::protobuf::internal::WireFormat::PARSE);\n"
                      );
  }
  return;
}

Assistant:

void RepeatedStringFieldGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) const {
  printer->Print(variables_,
    "DO_(::google::protobuf::internal::WireFormatLite::Read$declared_type$(\n"
    "      input, this->add_$name$()));\n");
  if (HasUtf8Verification(descriptor_->file()) &&
      descriptor_->type() == FieldDescriptor::TYPE_STRING) {
    printer->Print(variables_,
      "::google::protobuf::internal::WireFormat::VerifyUTF8String(\n"
      "  this->$name$(this->$name$_size() - 1).data(),\n"
      "  this->$name$(this->$name$_size() - 1).length(),\n"
      "  ::google::protobuf::internal::WireFormat::PARSE);\n");
  }
}